

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

Tim_Man_t * Tim_ManReduce(Tim_Man_t *p,Vec_Int_t *vBoxesLeft,int nTermsDiff)

{
  float fVar1;
  float fVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar8;
  float *pfVar9;
  float *Entry;
  void *pvVar10;
  Tim_Box_t *pTVar11;
  bool bVar12;
  int local_cc;
  int local_78;
  int local_74;
  int curPo;
  int curPi;
  int fWarning;
  int nNewPoNum;
  int nNewPiNum;
  int nOutputs;
  int nInputs;
  int nNewCos;
  int nNewCis;
  int iBox;
  int k;
  int i;
  float *pDelayTableNew;
  float *pDelayTable;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  Tim_Man_t *pNew;
  int nTermsDiff_local;
  Vec_Int_t *vBoxesLeft_local;
  Tim_Man_t *p_local;
  
  local_74 = Tim_ManPiNum(p);
  local_74 = local_74 - nTermsDiff;
  iVar5 = Tim_ManPoNum(p);
  iVar5 = iVar5 - nTermsDiff;
  iVar6 = Vec_IntSize(vBoxesLeft);
  iVar7 = Tim_ManBoxNum(p);
  if (iVar7 < iVar6) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x107,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  nOutputs = iVar5;
  nInputs = local_74;
  for (iBox = 0; iVar6 = Vec_IntSize(vBoxesLeft), iBox < iVar6; iBox = iBox + 1) {
    iVar6 = Vec_IntEntry(vBoxesLeft,iBox);
    pTVar11 = Tim_ManBox(p,iVar6);
    nInputs = pTVar11->nOutputs + nInputs;
    nOutputs = pTVar11->nInputs + nOutputs;
  }
  iVar6 = Tim_ManCiNum(p);
  if (nInputs <= iVar6 - nTermsDiff) {
    iVar6 = Tim_ManCoNum(p);
    if (iVar6 - nTermsDiff < nOutputs) {
      __assert_fail("nNewCos <= Tim_ManCoNum(p) - nTermsDiff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x112,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
    }
    iBox = 0;
    while( true ) {
      bVar12 = false;
      if (iBox < p->nCis) {
        pDelayTable = (float *)(p->pCis + iBox);
        bVar12 = (Tim_Obj_t *)pDelayTable != (Tim_Obj_t *)0x0;
      }
      if (!bVar12) break;
      pDelayTable[1] = 0.0;
      iBox = iBox + 1;
    }
    iBox = 0;
    while( true ) {
      bVar12 = false;
      if (iBox < p->nCos) {
        pDelayTable = (float *)(p->pCos + iBox);
        bVar12 = (Tim_Obj_t *)pDelayTable != (Tim_Obj_t *)0x0;
      }
      if (!bVar12) break;
      pDelayTable[1] = 0.0;
      iBox = iBox + 1;
    }
    p_00 = Tim_ManStart(nInputs,nOutputs);
    memcpy(p_00->pCis,p->pCis,(long)local_74 * 0x18);
    pTVar3 = p_00->pCos;
    pTVar4 = p->pCos;
    iVar6 = Tim_ManCoNum(p);
    iVar7 = Tim_ManPoNum(p);
    memcpy(pTVar3 + ((long)nOutputs - (long)iVar5),pTVar4 + ((long)iVar6 - (long)iVar7),
           (long)iVar5 * 0x18);
    iVar6 = Tim_ManDelayTableNum(p);
    if (0 < iVar6) {
      bVar12 = false;
      iVar6 = Vec_PtrSize(p->vDelayTables);
      pVVar8 = Vec_PtrStart(iVar6);
      p_00->vDelayTables = pVVar8;
      for (iBox = 0; iVar6 = Vec_PtrSize(p->vDelayTables), iBox < iVar6; iBox = iBox + 1) {
        pfVar9 = (float *)Vec_PtrEntry(p->vDelayTables,iBox);
        if (pfVar9 != (float *)0x0) {
          if ((iBox != (int)*pfVar9) && (!bVar12)) {
            printf("Warning: Mismatch in delay-table number between the manager and the box.\n");
            bVar12 = true;
          }
          fVar1 = pfVar9[1];
          fVar2 = pfVar9[2];
          Entry = (float *)malloc((long)((int)fVar1 * (int)fVar2 + 3) << 2);
          *Entry = (float)iBox;
          Entry[1] = (float)(int)pfVar9[1];
          Entry[2] = (float)(int)pfVar9[2];
          for (nNewCis = 0; nNewCis < (int)fVar1 * (int)fVar2; nNewCis = nNewCis + 1) {
            Entry[nNewCis + 3] = pfVar9[nNewCis + 3];
          }
          pvVar10 = Vec_PtrEntry(p_00->vDelayTables,iBox);
          if (pvVar10 != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0x137,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
          }
          Vec_PtrWriteEntry(p_00->vDelayTables,iBox,Entry);
        }
      }
    }
    iVar6 = Tim_ManBoxNum(p);
    if (0 < iVar6) {
      local_78 = 0;
      iVar6 = Tim_ManBoxNum(p);
      pVVar8 = Vec_PtrAlloc(iVar6);
      p_00->vBoxes = pVVar8;
      for (iBox = 0; iVar6 = Vec_IntSize(vBoxesLeft), iBox < iVar6; iBox = iBox + 1) {
        local_cc = Vec_IntEntry(vBoxesLeft,iBox);
        pTVar11 = Tim_ManBox(p,local_cc);
        Tim_ManCreateBox(p_00,local_78,pTVar11->nInputs,local_74,pTVar11->nOutputs,
                         pTVar11->iDelayTable,pTVar11->fBlack);
        iVar6 = Tim_ManBoxNum(p_00);
        iVar7 = Tim_ManBoxCopy(p,local_cc);
        if (iVar7 != -1) {
          local_cc = Tim_ManBoxCopy(p,local_cc);
        }
        Tim_ManBoxSetCopy(p_00,iVar6 + -1,local_cc);
        local_74 = pTVar11->nOutputs + local_74;
        local_78 = pTVar11->nInputs + local_78;
      }
      iVar6 = Tim_ManCiNum(p_00);
      if (local_74 != iVar6) {
        __assert_fail("curPi == Tim_ManCiNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0x14a,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
      }
      iVar6 = Tim_ManCoNum(p_00);
      if (iVar5 + local_78 != iVar6) {
        __assert_fail("curPo == Tim_ManCoNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0x14b,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
      }
    }
    return p_00;
  }
  __assert_fail("nNewCis <= Tim_ManCiNum(p) - nTermsDiff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                ,0x111,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
}

Assistant:

Tim_Man_t * Tim_ManReduce( Tim_Man_t * p, Vec_Int_t * vBoxesLeft, int nTermsDiff )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, iBox, nNewCis, nNewCos, nInputs, nOutputs;
    int nNewPiNum = Tim_ManPiNum(p) - nTermsDiff;
    int nNewPoNum = Tim_ManPoNum(p) - nTermsDiff;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = nNewPiNum;
    nNewCos = nNewPoNum;
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        pBox = Tim_ManBox( p, iBox );
        nNewCis += pBox->nOutputs;
        nNewCos += pBox->nInputs;
    }
    assert( nNewCis <= Tim_ManCiNum(p) - nTermsDiff );
    assert( nNewCos <= Tim_ManCoNum(p) - nTermsDiff );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * nNewPiNum );
    memcpy( pNew->pCos + nNewCos - nNewPoNum, 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * nNewPoNum );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        int fWarning = 0;
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            if ( i != (int)pDelayTable[0] && fWarning == 0 )
            {
                printf( "Warning: Mismatch in delay-table number between the manager and the box.\n" );
                fWarning = 1;
            }
            //assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = i;//(int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = nNewPiNum;
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Vec_IntForEachEntry( vBoxesLeft, iBox, i )
        {
            pBox = Tim_ManBox( p, iBox );
            Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
            Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, iBox) == -1 ? iBox : Tim_ManBoxCopy(p, iBox) );
            curPi += pBox->nOutputs;
            curPo += pBox->nInputs;
        }
        curPo += nNewPoNum;
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}